

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O0

void duckdb::ArrayFixedCombine<float,duckdb::CrossProductOp,3ul>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference pvVar2;
  InvalidInputException *pIVar3;
  Vector *in_RDX;
  DataChunk *in_RDI;
  float *res_data_ptr;
  float *rhs_data_ptr;
  float *lhs_data_ptr;
  unsigned_long result_offset;
  unsigned_long right_offset;
  unsigned_long left_offset;
  idx_t rhs_idx;
  idx_t lhs_idx;
  idx_t i;
  float *res_data;
  float *rhs_data;
  float *lhs_data;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  ValidityMask *rhs_child_validity;
  ValidityMask *lhs_child_validity;
  Vector *res_child;
  Vector *rhs_child;
  Vector *lhs_child;
  idx_t count;
  string *func_name;
  BoundFunctionExpression *expr;
  ExecuteFunctionState *lstate;
  size_type in_stack_fffffffffffffd68;
  UnifiedVectorFormat *in_stack_fffffffffffffd70;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  idx_t in_stack_fffffffffffffd80;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffd88;
  BaseExpression *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [32];
  long local_1b0;
  undefined1 local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  string local_158 [32];
  long local_138;
  idx_t local_130;
  idx_t local_128;
  UnifiedVectorFormat *local_120;
  float *local_118;
  float *local_110;
  float *local_108;
  SelectionVector *local_f0 [9];
  SelectionVector *local_a8 [9];
  ValidityMask *local_60;
  ValidityMask *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  UnifiedVectorFormat *local_38;
  BoundFunctionExpression *local_30;
  BoundFunctionExpression *local_28;
  ExecuteFunctionState *local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = ExpressionState::Cast<duckdb::ExecuteFunctionState>
                       ((ExpressionState *)in_stack_fffffffffffffd70);
  local_28 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_fffffffffffffdb0);
  local_30 = local_28 + 0x60;
  local_38 = (UnifiedVectorFormat *)DataChunk::size(local_8);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd70,
                      in_stack_fffffffffffffd68);
  local_40 = duckdb::ArrayVector::GetEntry(pvVar2);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd70,
                      in_stack_fffffffffffffd68);
  local_48 = duckdb::ArrayVector::GetEntry(pvVar2);
  local_50 = duckdb::ArrayVector::GetEntry(local_18);
  local_58 = FlatVector::Validity((Vector *)0xbc62eb);
  local_60 = FlatVector::Validity((Vector *)0xbc6300);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_a8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_f0);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd70,
                      in_stack_fffffffffffffd68);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar2,local_38);
  pvVar2 = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffd70,
                      in_stack_fffffffffffffd68);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar2,local_38);
  local_108 = FlatVector::GetData<float>((Vector *)0xbc639a);
  local_110 = FlatVector::GetData<float>((Vector *)0xbc63bb);
  local_118 = FlatVector::GetData<float>((Vector *)0xbc63dc);
  local_120 = (UnifiedVectorFormat *)0x0;
  do {
    if (local_38 <= local_120) {
      if (local_38 == (UnifiedVectorFormat *)0x1) {
        duckdb::Vector::SetVectorType((VectorType)local_18);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffd70);
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffd70);
      return;
    }
    local_128 = SelectionVector::get_index(local_a8[0],(idx_t)local_120);
    local_130 = SelectionVector::get_index(local_f0[0],(idx_t)local_120);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)
                       CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                       (idx_t)in_stack_fffffffffffffd70);
    if ((bVar1) &&
       (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)
                           CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                           (idx_t)in_stack_fffffffffffffd70), bVar1)) {
      local_138 = local_128 * 3;
      bVar1 = TemplatedValidityMask<unsigned_long>::CheckAllValid
                        (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                         CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      if (!bVar1) {
        local_1a1 = 1;
        pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        paVar4 = &local_179;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_178,"%s: left argument can not contain NULL values",paVar4);
        std::__cxx11::string::string(local_1a0,(string *)local_30);
        StringUtil::Format<std::__cxx11::string>
                  (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        duckdb::InvalidInputException::InvalidInputException(pIVar3,local_158);
        local_1a1 = 0;
        __cxa_throw(pIVar3,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      local_1b0 = local_130 * 3;
      in_stack_fffffffffffffd7f =
           TemplatedValidityMask<unsigned_long>::CheckAllValid
                     (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                      CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      if (!(bool)in_stack_fffffffffffffd7f) {
        pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        paVar4 = &local_1f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1f0,"%s: right argument can not contain NULL values",paVar4);
        std::__cxx11::string::string(local_218,(string *)local_30);
        StringUtil::Format<std::__cxx11::string>
                  (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        duckdb::InvalidInputException::InvalidInputException(pIVar3,local_1d0);
        __cxa_throw(pIVar3,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      in_stack_fffffffffffffdc8 = (string *)(local_110 + local_1b0);
      in_stack_fffffffffffffdc0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_118 + (long)local_120 * 3);
      CrossProductOp::Operation<float>
                (local_108 + local_138,(float *)in_stack_fffffffffffffdc8,
                 (float *)in_stack_fffffffffffffdc0,3);
    }
    else {
      duckdb::FlatVector::SetNull(local_18,(ulong)local_120,true);
    }
    local_120 = local_120 + 1;
  } while( true );
}

Assistant:

static void ArrayFixedCombine(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);
	auto &res_child = ArrayVector::GetEntry(result);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(res_child);

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * N;
		if (!lhs_child_validity.CheckAllValid(left_offset + N, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * N;
		if (!rhs_child_validity.CheckAllValid(right_offset + N, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}
		const auto result_offset = i * N;

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;
		const auto res_data_ptr = res_data + result_offset;

		OP::Operation(lhs_data_ptr, rhs_data_ptr, res_data_ptr, N);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}